

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_TAGGED_PROPERTY_Array_Unmarshal
                 (TPMS_TAGGED_PROPERTY *target,BYTE **buffer,INT32 *size,INT32 count)

{
  TPM_RC TVar1;
  ulong uVar2;
  
  if (0 < count) {
    uVar2 = (ulong)(uint)count;
    do {
      TVar1 = TPMS_TAGGED_PROPERTY_Unmarshal(target,buffer,size);
      if (TVar1 != 0) {
        return TVar1;
      }
      target = target + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return 0;
}

Assistant:

TPM_RC
TPMS_TAGGED_PROPERTY_Array_Unmarshal(TPMS_TAGGED_PROPERTY *target, BYTE **buffer, INT32 *size, INT32 count)
{
    TPM_RC    result;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = TPMS_TAGGED_PROPERTY_Unmarshal(&target[i], buffer, size);
        if(result != TPM_RC_SUCCESS)
            return result;
    }
    return TPM_RC_SUCCESS;
}